

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseExtParsedEnt(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  setDocumentLocatorSAXFunc p_Var2;
  void *pvVar3;
  startDocumentSAXFunc p_Var4;
  endDocumentSAXFunc p_Var5;
  xmlParserErrors error;
  xmlCharEncoding enc;
  undefined8 in_RAX;
  xmlSAXLocator *pxVar6;
  xmlChar *pxVar7;
  int iVar8;
  long lStack_30;
  undefined8 uStack_28;
  
  iVar8 = -1;
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return -1;
  }
  if (ctxt->input == (xmlParserInputPtr)0x0) {
    return -1;
  }
  uStack_28 = in_RAX;
  xmlDefaultSAXHandlerInit();
  xmlDetectSAX2(ctxt);
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
     (p_Var2 = ctxt->sax->setDocumentLocator, p_Var2 != (setDocumentLocatorSAXFunc)0x0)) {
    pvVar3 = ctxt->userData;
    pxVar6 = __xmlDefaultSAXLocator();
    (*p_Var2)(pvVar3,pxVar6);
  }
  pxVar7 = ctxt->input->cur;
  if (3 < (long)ctxt->input->end - (long)pxVar7) {
    uStack_28 = CONCAT44(*(undefined4 *)pxVar7,(undefined4)uStack_28);
    enc = xmlDetectCharEncoding((uchar *)((long)&uStack_28 + 4),4);
    if (enc != XML_CHAR_ENCODING_NONE) {
      xmlSwitchEncoding(ctxt,enc);
    }
  }
  if (*ctxt->input->cur == '\0') {
    xmlFatalErr(ctxt,XML_ERR_DOCUMENT_EMPTY,(char *)0x0);
  }
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (ctxt->mlType == XML_TYPE_SML) {
    pxVar7 = ctxt->input->cur;
    if ((((*pxVar7 == '?') && (pxVar7[1] == 'x')) && (pxVar7[2] == 'm')) && (pxVar7[3] == 'l')) {
      lStack_30 = 4;
      goto LAB_00165203;
    }
  }
  else if ((((ctxt->mlType == XML_TYPE_XML) && (pxVar7 = ctxt->input->cur, *pxVar7 == '<')) &&
           ((pxVar7[1] == '?' && ((pxVar7[2] == 'x' && (pxVar7[3] == 'm')))))) && (pxVar7[4] == 'l')
          ) {
    lStack_30 = 5;
LAB_00165203:
    if (((ulong)pxVar7[lStack_30] < 0x21) &&
       ((0x100002600U >> ((ulong)pxVar7[lStack_30] & 0x3f) & 1) != 0)) {
      xmlParseXMLDecl(ctxt);
      if (ctxt->errNo == 0x20) {
        return -1;
      }
      xmlSkipBlankChars(ctxt);
      goto LAB_0016524d;
    }
  }
  pxVar7 = xmlCharStrdup("1.0");
  ctxt->version = pxVar7;
LAB_0016524d:
  if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
      (p_Var4 = ctxt->sax->startDocument, p_Var4 != (startDocumentSAXFunc)0x0)) &&
     (ctxt->disableSAX == 0)) {
    (*p_Var4)(ctxt->userData);
  }
  if (ctxt->instate != XML_PARSER_EOF) {
    ctxt->instate = XML_PARSER_CONTENT;
    ctxt->validate = 0;
    ctxt->loadsubset = 0;
    ctxt->depth = 0;
    xmlParseContent(ctxt);
    if (ctxt->instate != XML_PARSER_EOF) {
      pxVar7 = ctxt->input->cur;
      xVar1 = *pxVar7;
      if (xVar1 != '\0') {
        if ((xVar1 == '<') && (pxVar7[1] == '/')) {
          error = XML_ERR_NOT_WELL_BALANCED;
        }
        else {
          error = XML_ERR_EXTRA_CONTENT;
        }
        xmlFatalErr(ctxt,error,(char *)0x0);
      }
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var5 = ctxt->sax->endDocument, p_Var5 != (endDocumentSAXFunc)0x0)) {
        (*p_Var5)(ctxt->userData);
      }
      iVar8 = -(uint)(ctxt->wellFormed == 0);
    }
  }
  return iVar8;
}

Assistant:

int
xmlParseExtParsedEnt(xmlParserCtxtPtr ctxt) {
    xmlChar start[4];
    xmlCharEncoding enc;

    if ((ctxt == NULL) || (ctxt->input == NULL))
        return(-1);

    xmlDefaultSAXHandlerInit();

    xmlDetectSAX2(ctxt);

    GROW;

    /*
     * SAX: beginning of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->setDocumentLocator))
        ctxt->sax->setDocumentLocator(ctxt->userData, &xmlDefaultSAXLocator);

    /*
     * Get the 4 first bytes and decode the charset
     * if enc != XML_CHAR_ENCODING_NONE
     * plug some encoding conversion routines.
     */
    if ((ctxt->input->end - ctxt->input->cur) >= 4) {
	start[0] = RAW;
	start[1] = NXT(1);
	start[2] = NXT(2);
	start[3] = NXT(3);
	enc = xmlDetectCharEncoding(start, 4);
	if (enc != XML_CHAR_ENCODING_NONE) {
	    xmlSwitchEncoding(ctxt, enc);
	}
    }


    if (CUR == 0) {
	xmlFatalErr(ctxt, XML_ERR_DOCUMENT_EMPTY, NULL);
    }

    /*
     * Check for the XMLDecl in the Prolog.
     */
    GROW;
    if ((CMP5_MLI(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT_MLI(5)))) {

	/*
	 * Note that we will switch encoding on the fly.
	 */
	xmlParseXMLDecl(ctxt);
	if (ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) {
	    /*
	     * The XML REC instructs us to stop parsing right here
	     */
	    return(-1);
	}
	SKIP_BLANKS;
    } else {
	ctxt->version = xmlCharStrdup(XML_DEFAULT_VERSION);
    }
    if ((ctxt->sax) && (ctxt->sax->startDocument) && (!ctxt->disableSAX))
        ctxt->sax->startDocument(ctxt->userData);
    if (ctxt->instate == XML_PARSER_EOF)
	return(-1);

    /*
     * Doing validity checking on chunk doesn't make sense
     */
    ctxt->instate = XML_PARSER_CONTENT;
    ctxt->validate = 0;
    ctxt->loadsubset = 0;
    ctxt->depth = 0;

    xmlParseContent(ctxt);
    if (ctxt->instate == XML_PARSER_EOF)
	return(-1);

    if ((RAW == '<') && (NXT(1) == '/')) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    } else if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXTRA_CONTENT, NULL);
    }

    /*
     * SAX: end of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
        ctxt->sax->endDocument(ctxt->userData);

    if (! ctxt->wellFormed) return(-1);
    return(0);
}